

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O0

pboolean p_semaphore_release(PSemaphore *sem,PError **error)

{
  int iVar1;
  PErrorIPC code;
  pint native_code;
  pboolean ret;
  PError **error_local;
  PSemaphore *sem_local;
  
  if (sem == (PSemaphore *)0x0) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    sem_local._4_4_ = 0;
  }
  else {
    iVar1 = sem_post((sem_t *)sem->sem_hdl);
    sem_local._4_4_ = (uint)(iVar1 == 0);
    if (sem_local._4_4_ == 0) {
      code = p_error_get_last_ipc();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to call sem_post() on semaphore");
    }
  }
  return sem_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_semaphore_release (PSemaphore	*sem,
		     PError	**error)
{
	pboolean ret;

	if (P_UNLIKELY (sem == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	ret = (sem_post (sem->sem_hdl) == 0);

	if (P_UNLIKELY (ret == FALSE))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call sem_post() on semaphore");

	return ret;
}